

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathNodeSetAdd(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  long lVar2;
  
  iVar1 = -1;
  if (val != (xmlNodePtr)0x0 && cur != (xmlNodeSetPtr)0x0) {
    iVar1 = cur->nodeNr;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        if (cur->nodeTab[lVar2] == val) goto LAB_001ba81f;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    if ((cur->nodeMax <= iVar1) && (iVar1 = xmlXPathNodeSetGrow(cur), iVar1 < 0)) {
      return -1;
    }
    if ((val->type == XML_NAMESPACE_DECL) &&
       (val = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val), val == (xmlNodePtr)0x0)
       ) {
      return -1;
    }
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + 1;
    cur->nodeTab[iVar1] = val;
LAB_001ba81f:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlXPathNodeSetAdd(xmlNodeSetPtr cur, xmlNodePtr val) {
    int i;

    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++)
        if (cur->nodeTab[i] == val) return(0);

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeNr >= cur->nodeMax) {
        if (xmlXPathNodeSetGrow(cur) < 0)
            return(-1);
    }

    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;
        xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

        if (nsNode == NULL)
            return(-1);
	cur->nodeTab[cur->nodeNr++] = nsNode;
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}